

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_dpb.c
# Opt level: O0

H265eDpbFrm * h265e_find_cpb_frame(H265eDpbFrm *frms,RK_S32 cnt,EncFrmStatus *frm)

{
  uint uVar1;
  EncFrmStatus *pEVar2;
  EncFrmStatus *p;
  RK_S32 i;
  RK_S32 seq_idx;
  EncFrmStatus *frm_local;
  RK_S32 cnt_local;
  H265eDpbFrm *frms_local;
  
  uVar1 = (uint)(ushort)(frm->val >> 0x30);
  if ((frm->val & 1) != 0) {
    if ((h265e_debug & 0x80) != 0) {
      _mpp_log_l(4,"h265e_dpb","frm %d start finding slot \n",(char *)0x0,frm->val >> 0x30);
    }
    for (p._0_4_ = 0; (int)(uint)p < cnt; p._0_4_ = (uint)p + 1) {
      if (((((uint)frms[(int)(uint)p].field_7 & 0xff) != 0) &&
          (pEVar2 = &frms[(int)(uint)p].status, (pEVar2->val & 1) != 0)) &&
         ((ushort)(pEVar2->val >> 0x30) == uVar1)) {
        if ((h265e_debug & 0x80) != 0) {
          _mpp_log_l(4,"h265e_dpb","frm %d match slot %d valid %d\n",(char *)0x0,pEVar2->val >> 0x30
                     ,(ulong)(uint)p,(uint)pEVar2->val & 1);
        }
        if ((frm->val >> 2 & 1) != 0) {
          return frms + (int)(uint)p;
        }
        if ((((uint)(pEVar2->val >> 6) & 1) != ((uint)(frm->val >> 6) & 1)) &&
           (_mpp_log_l(2,"h265e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                       "p->is_non_ref == frm->is_non_ref","h265e_find_cpb_frame",0x21e),
           (mpp_debug & 0x10000000) != 0)) {
          abort();
        }
        if ((((uint)(pEVar2->val >> 7) & 1) != ((uint)(frm->val >> 7) & 1)) &&
           (_mpp_log_l(2,"h265e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                       "p->is_lt_ref == frm->is_lt_ref","h265e_find_cpb_frame",0x21f),
           (mpp_debug & 0x10000000) != 0)) {
          abort();
        }
        if ((((uint)(pEVar2->val >> 8) & 0xf) != ((uint)(frm->val >> 8) & 0xf)) &&
           (_mpp_log_l(2,"h265e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                       "p->lt_idx == frm->lt_idx","h265e_find_cpb_frame",0x220),
           (mpp_debug & 0x10000000) != 0)) {
          abort();
        }
        if ((((uint)(pEVar2->val >> 0xc) & 0xf) != ((uint)(frm->val >> 0xc) & 0xf)) &&
           (_mpp_log_l(2,"h265e_dpb","Assertion %s failed at %s:%d\n",(char *)0x0,
                       "p->temporal_id == frm->temporal_id","h265e_find_cpb_frame",0x221),
           (mpp_debug & 0x10000000) != 0)) {
          abort();
        }
        return frms + (int)(uint)p;
      }
    }
    _mpp_log_l(2,"h265e_dpb","can not find match frm %d\n","h265e_find_cpb_frame",(ulong)uVar1);
  }
  return (H265eDpbFrm *)0x0;
}

Assistant:

static H265eDpbFrm *h265e_find_cpb_frame(H265eDpbFrm *frms, RK_S32 cnt, EncFrmStatus *frm)
{
    RK_S32 seq_idx = frm->seq_idx;
    RK_S32 i;

    if (!frm->valid)
        return NULL;

    h265e_dbg_dpb("frm %d start finding slot \n", frm->seq_idx);
    for (i = 0; i < cnt; i++) {
        if (!frms[i].dpb_used) {
            continue;
        }

        EncFrmStatus *p = &frms[i].status;

        if (p->valid && p->seq_idx == seq_idx) {
            h265e_dbg_dpb("frm %d match slot %d valid %d\n",
                          p->seq_idx, i, p->valid);
            if (frm->save_pass1)
                return &frms[i];
            mpp_assert(p->is_non_ref == frm->is_non_ref);
            mpp_assert(p->is_lt_ref == frm->is_lt_ref);
            mpp_assert(p->lt_idx == frm->lt_idx);
            mpp_assert(p->temporal_id == frm->temporal_id);
            return &frms[i];
        }
    }

    mpp_err_f("can not find match frm %d\n", seq_idx);

    return NULL;
}